

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RobSubstitution.cpp
# Opt level: O1

SubstIterator __thiscall
Kernel::RobSubstitution::getAssocIterator<Kernel::RobSubstitution::MatchingFn>
          (RobSubstitution *this,RobSubstitution *subst,Literal *l1,int l1Index,Literal *l2,
          int l2Index,bool complementary)

{
  bool bVar1;
  undefined8 *puVar2;
  undefined4 in_register_0000000c;
  Literal *l1_00;
  undefined4 in_register_0000008c;
  undefined3 in_stack_00000009;
  bool in_stack_00000010;
  undefined6 uStack_7e;
  undefined1 uStack_78;
  undefined7 uStack_77;
  undefined1 uStack_70;
  undefined3 uStack_6f;
  undefined4 uStack_6c;
  undefined1 uStack_68;
  undefined7 uStack_67;
  undefined4 uStack_5c;
  uint local_50;
  undefined4 uStack_4c;
  
  l1_00 = (Literal *)CONCAT44(in_register_0000000c,l1Index);
  bVar1 = Literal::headersMatch
                    (l1_00,(Literal *)CONCAT44(in_register_0000008c,l2Index),in_stack_00000010);
  if (bVar1) {
    if ((l1_00->super_Term)._functor == 0) {
      puVar2 = (undefined8 *)::operator_new(0x50);
      *(undefined4 *)(puVar2 + 1) = 0;
      *puVar2 = &PTR__AssocIterator_00b69388;
      puVar2[2] = l1;
      puVar2[3] = l1_00;
      *(int *)(puVar2 + 4) = (int)l2;
      puVar2[5] = CONCAT44(in_register_0000008c,l2Index);
      *(undefined4 *)(puVar2 + 6) = _complementary;
      puVar2[7] = 0;
      puVar2[8] = 0;
      *(undefined4 *)(puVar2 + 9) = 0;
      *(undefined1 *)((long)puVar2 + 0x4c) = 1;
      (this->super_Backtrackable)._bdStack._capacity = (size_t)puVar2;
      *(undefined4 *)(puVar2 + 1) = 1;
    }
    else {
      uStack_78 = (undefined1)l1Index;
      uStack_77 = (undefined7)((ulong)l1_00 >> 8);
      uStack_68 = (undefined1)l2Index;
      uStack_67 = (undefined7)(CONCAT44(in_register_0000008c,l2Index) >> 8);
      local_50 = local_50 & 0xffffff00;
      puVar2 = (undefined8 *)::operator_new(0x60,8);
      *(undefined4 *)(puVar2 + 1) = 0;
      *puVar2 = &PTR__ProxyIterator_00b69330;
      *(undefined1 *)(puVar2 + 2) = 0;
      uStack_70 = SUB81(l2,0);
      uStack_6f = (undefined3)((ulong)l2 >> 8);
      *(ulong *)((long)puVar2 + 0x11) = CONCAT17(uStack_78,CONCAT61(uStack_7e,1));
      *(ulong *)((long)puVar2 + 0x19) = CONCAT17(uStack_70,uStack_77);
      *(ulong *)((long)puVar2 + 0x21) = CONCAT17(uStack_68,CONCAT43(uStack_6c,uStack_6f));
      *(ulong *)((long)puVar2 + 0x29) = CONCAT17(complementary,uStack_67);
      puVar2[6] = CONCAT44(uStack_5c,_complementary);
      puVar2[7] = 0;
      *(uint *)(puVar2 + 8) = local_50;
      *(undefined4 *)((long)puVar2 + 0x44) = uStack_4c;
      puVar2[9] = l1;
      *(undefined1 *)(puVar2 + 10) = 0;
      (this->super_Backtrackable)._bdStack._capacity = (size_t)puVar2;
      *(int *)(puVar2 + 1) = *(int *)(puVar2 + 1) + 1;
    }
  }
  else {
    ::Lib::VirtualIterator<Kernel::RobSubstitution_*>::getEmpty();
  }
  return (SubstIterator)(IteratorCore<Kernel::RobSubstitution_*> *)this;
}

Assistant:

SubstIterator RobSubstitution::getAssocIterator(RobSubstitution* subst,
	  Literal* l1, int l1Index, Literal* l2, int l2Index, bool complementary)
{
  if( !Literal::headersMatch(l1,l2,complementary) ) {
    return SubstIterator::getEmpty();
  }

  if( !l1->isEquality() ) {
    return pvi( getContextualIterator(getSingletonIterator(subst),
	    AssocContext<Fn>(l1, l1Index, l2, l2Index)) );
  } else {
    return vi(
	    new AssocIterator<Fn>(subst, l1, l1Index, l2, l2Index));
  }
}